

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int ptls_receive(ptls_t *tls,ptls_buffer_t *decryptbuf,void *_input,size_t *inlen)

{
  size_t sVar1;
  long lVar2;
  long *in_RCX;
  ptls_handshake_properties_t *in_RDX;
  ptls_message_emitter_t *in_RSI;
  ptls_t *in_RDI;
  bool bVar3;
  size_t consumed;
  int ret;
  size_t decryptbuf_orig_size;
  uint8_t *end;
  uint8_t *input;
  int local_3c;
  ptls_handshake_properties_t *properties;
  ptls_handshake_properties_t *decryptbuf_00;
  
  properties = (ptls_handshake_properties_t *)((long)&in_RDX->field_0 + *in_RCX);
  sVar1 = in_RSI->record_header_length;
  local_3c = 0;
  decryptbuf_00 = in_RDX;
  if (PTLS_STATE_SERVER_EXPECT_CERTIFICATE_VERIFY < in_RDI->state) {
    while( true ) {
      bVar3 = false;
      if ((local_3c == 0) && (bVar3 = false, in_RDX != properties)) {
        bVar3 = sVar1 == in_RSI->record_header_length;
      }
      if (!bVar3) break;
      lVar2 = (long)properties - (long)in_RDX;
      local_3c = handle_input(in_RDI,in_RSI,(ptls_buffer_t *)decryptbuf_00,in_RCX,(size_t *)in_RDX,
                              properties);
      in_RDX = (ptls_handshake_properties_t *)((long)in_RDX + lVar2);
      if (((local_3c != 0) && (local_3c != 0x100)) && (local_3c == 0x202)) {
        local_3c = 0;
      }
    }
    *in_RCX = *in_RCX - ((long)properties - (long)in_RDX);
    return local_3c;
  }
  __assert_fail("tls->state >= PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                ,0x131c,"int ptls_receive(ptls_t *, ptls_buffer_t *, const void *, size_t *)");
}

Assistant:

int ptls_receive(ptls_t *tls, ptls_buffer_t *decryptbuf, const void *_input, size_t *inlen)
{
    const uint8_t *input = (const uint8_t *)_input, *const end = input + *inlen;
    size_t decryptbuf_orig_size = decryptbuf->off;
    int ret = 0;

    assert(tls->state >= PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA);

    /* loop until we decrypt some application data (or an error) */
    while (ret == 0 && input != end && decryptbuf_orig_size == decryptbuf->off) {
        size_t consumed = end - input;
        ret = handle_input(tls, NULL, decryptbuf, input, &consumed, NULL);
        input += consumed;

        switch (ret) {
        case 0:
            break;
        case PTLS_ERROR_IN_PROGRESS:
            ret = 0;
            break;
        case PTLS_ERROR_CLASS_PEER_ALERT + PTLS_ALERT_CLOSE_NOTIFY:
            /* TODO send close alert */
            break;
        default:
            if (PTLS_ERROR_GET_CLASS(ret) == PTLS_ERROR_CLASS_SELF_ALERT) {
                /* TODO send alert */
            }
            break;
        }
    }

    *inlen -= end - input;

    return ret;
}